

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  ImGuiContext *pIVar1;
  ImGuiStyleVarInfo *this;
  float *pfVar2;
  ImGuiStyleVar in_EDI;
  float in_XMM0_Da;
  float *pvar;
  ImGuiContext *g;
  ImGuiStyleVarInfo *var_info;
  ImGuiStyleMod *v;
  ImVector<ImGuiStyleMod> *in_stack_ffffffffffffffd0;
  
  this = GetStyleVarInfo(in_EDI);
  pIVar1 = GImGui;
  if ((this->Type == 8) && (this->Count == 1)) {
    pfVar2 = (float *)ImGuiStyleVarInfo::GetVarPtr(this,&GImGui->Style);
    v = (ImGuiStyleMod *)&pIVar1->StyleVarStack;
    ImGuiStyleMod::ImGuiStyleMod((ImGuiStyleMod *)&stack0xffffffffffffffd4,in_EDI,*pfVar2);
    ImVector<ImGuiStyleMod>::push_back(in_stack_ffffffffffffffd0,v);
    *pfVar2 = in_XMM0_Da;
  }
  return;
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 1)
    {
        ImGuiContext& g = *GImGui;
        float* pvar = (float*)var_info->GetVarPtr(&g.Style);
        g.StyleVarStack.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0 && "Called PushStyleVar() float variant but variable is not a float!");
}